

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int dom_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t dst;
  int iVar1;
  in_edge_t_conflict elem;
  bitmap_t prev_dom_in;
  edge_t_conflict head;
  edge_t_conflict e;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  dst = gen_ctx->temp_bitmap;
  bitmap_copy(dst,bb->dom_in);
  elem = DLIST_in_edge_t_head(&bb->in_edges);
  bitmap_copy(bb->dom_in,elem->src->dom_out);
  for (head = DLIST_in_edge_t_next(elem); head != (edge_t_conflict)0x0;
      head = DLIST_in_edge_t_next(head)) {
    bitmap_and(bb->dom_in,bb->dom_in,head->src->dom_out);
  }
  iVar1 = bitmap_equal_p(bb->dom_in,dst);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int dom_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_dom_in = temp_bitmap;

  bitmap_copy (prev_dom_in, bb->dom_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->dom_in, head->src->dom_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->dom_in, bb->dom_in, e->src->dom_out); /* dom_in &= dom_out */
  return !bitmap_equal_p (bb->dom_in, prev_dom_in);
}